

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_select(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  int local_20;
  int i;
  int n;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  iVar2 = lua_type(L,1);
  if ((iVar2 == 4) && (pcVar3 = lua_tolstring(L,1,(size_t *)0x0), *pcVar3 == '#')) {
    lua_pushinteger(L,(long)(iVar1 + -1));
    L_local._4_4_ = 1;
  }
  else {
    lVar4 = luaL_checkinteger(L,1);
    local_20 = (int)lVar4;
    if (local_20 < 0) {
      local_20 = iVar1 + local_20;
    }
    else if (iVar1 < local_20) {
      local_20 = iVar1;
    }
    if (local_20 < 1) {
      luaL_argerror(L,1,"index out of range");
    }
    L_local._4_4_ = iVar1 - local_20;
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_select (lua_State *L) {
  int n = lua_gettop(L);
  if (lua_type(L, 1) == LUA_TSTRING && *lua_tostring(L, 1) == '#') {
    lua_pushinteger(L, n-1);
    return 1;
  }
  else {
    int i = luaL_checkint(L, 1);
    if (i < 0) i = n + i;
    else if (i > n) i = n;
    luaL_argcheck(L, 1 <= i, 1, "index out of range");
    return n - i;
  }
}